

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LogicalAndLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicaland(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x357) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x357;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LogicalAndLayerParams::LogicalAndLayerParams(this_00.logicaland_);
    (this->layer_).logicaland_ = (LogicalAndLayerParams *)this_00;
  }
  return (LogicalAndLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalAndLayerParams* NeuralNetworkLayer::mutable_logicaland() {
  if (!has_logicaland()) {
    clear_layer();
    set_has_logicaland();
    layer_.logicaland_ = new ::CoreML::Specification::LogicalAndLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalAnd)
  return layer_.logicaland_;
}